

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

Own<const_kj::Directory> __thiscall
kj::Directory::openSubdir(Directory *this,PathPtr path,WriteMode mode)

{
  Clock *params;
  undefined4 in_register_0000000c;
  InMemoryDirectory *extraout_RDX;
  InMemoryDirectory *extraout_RDX_00;
  InMemoryDirectory *extraout_RDX_01;
  InMemoryDirectory *extraout_RDX_02;
  InMemoryDirectory *extraout_RDX_03;
  InMemoryDirectory *pIVar1;
  uint in_R8D;
  Own<kj::(anonymous_namespace)::InMemoryDirectory> OVar2;
  Own<const_kj::Directory> OVar3;
  Fault f;
  _func_int **pp_Stack_38;
  PathPtr path_local;
  
  path_local.parts.size_ = CONCAT44(in_register_0000000c,mode);
  path_local.parts.ptr = (String *)path.parts.size_;
  (**(code **)(((path.parts.ptr)->content).ptr + 0x88))(&f);
  if (pp_Stack_38 == (_func_int **)0x0) {
    if ((in_R8D & 3) == 1) {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[25],kj::PathPtr&>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x262,FAILED,(char *)0x0,"\"directory already exists\", path",
                 (char (*) [25])"directory already exists",&path_local);
      _::Debug::Fault::~Fault(&f);
      pIVar1 = extraout_RDX_00;
    }
    else if ((in_R8D & 3) == 2) {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[25],kj::PathPtr&>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x264,FAILED,(char *)0x0,"\"directory does not exist\", path",
                 (char (*) [25])"directory does not exist",&path_local);
      _::Debug::Fault::~Fault(&f);
      pIVar1 = extraout_RDX_01;
    }
    else if ((in_R8D & 3) == 0) {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[58],kj::PathPtr&>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x266,FAILED,(char *)0x0,
                 "\"neither WriteMode::CREATE nor WriteMode::MODIFY was given\", path",
                 (char (*) [58])"neither WriteMode::CREATE nor WriteMode::MODIFY was given",
                 &path_local);
      _::Debug::Fault::~Fault(&f);
      pIVar1 = extraout_RDX_03;
    }
    else {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[55],kj::PathPtr&>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x269,FAILED,(char *)0x0,
                 "\"tryOpenSubdir() returned null despite no preconditions\", path",
                 (char (*) [55])"tryOpenSubdir() returned null despite no preconditions",&path_local
                );
      _::Debug::Fault::~Fault(&f);
      pIVar1 = extraout_RDX_02;
    }
  }
  else {
    (this->super_ReadableDirectory).super_FsNode._vptr_FsNode = (_func_int **)f.exception;
    this[1].super_ReadableDirectory.super_FsNode._vptr_FsNode = pp_Stack_38;
    pIVar1 = extraout_RDX;
  }
  if (pp_Stack_38 == (_func_int **)0x0) {
    params = nullClock();
    OVar2 = atomicRefcounted<kj::(anonymous_namespace)::InMemoryDirectory,kj::Clock_const&>
                      ((kj *)&f,params);
    pIVar1 = OVar2.ptr;
    (this->super_ReadableDirectory).super_FsNode._vptr_FsNode = (_func_int **)f.exception;
    this[1].super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)0x0;
  }
  OVar3.ptr = &pIVar1->super_Directory;
  OVar3.disposer = (Disposer *)this;
  return OVar3;
}

Assistant:

Own<const Directory> Directory::openSubdir(PathPtr path, WriteMode mode) const {
  KJ_IF_MAYBE(f, tryOpenSubdir(path, mode)) {
    return kj::mv(*f);
  } else if (has(mode, WriteMode::CREATE) && !has(mode, WriteMode::MODIFY)) {
    KJ_FAIL_REQUIRE("directory already exists", path) { break; }
  } else if (has(mode, WriteMode::MODIFY) && !has(mode, WriteMode::CREATE)) {
    KJ_FAIL_REQUIRE("directory does not exist", path) { break; }
  } else if (!has(mode, WriteMode::MODIFY) && !has(mode, WriteMode::CREATE)) {
    KJ_FAIL_ASSERT("neither WriteMode::CREATE nor WriteMode::MODIFY was given", path) { break; }
  } else {
    // Shouldn't happen.
    KJ_FAIL_ASSERT("tryOpenSubdir() returned null despite no preconditions", path) { break; }